

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

void lodepng_state_copy(LodePNGState *dest,LodePNGState *source)

{
  uint uVar1;
  LodePNGState *in_RSI;
  LodePNGInfo *in_RDI;
  LodePNGState *in_stack_ffffffffffffffe8;
  
  lodepng_state_cleanup((LodePNGState *)0x679c78);
  LodePNGState::operator=(in_RSI,in_stack_ffffffffffffffe8);
  lodepng_color_mode_init((LodePNGColorMode *)&(in_RDI->time).month);
  lodepng_info_init((LodePNGInfo *)0x679ca9);
  uVar1 = lodepng_color_mode_copy((LodePNGColorMode *)in_RDI,(LodePNGColorMode *)in_RSI);
  *(uint *)in_RDI[1].unknown_chunks_data = uVar1;
  if (*(int *)in_RDI[1].unknown_chunks_data == 0) {
    uVar1 = lodepng_info_copy(in_RDI,(LodePNGInfo *)in_RSI);
    *(uint *)in_RDI[1].unknown_chunks_data = uVar1;
  }
  return;
}

Assistant:

void lodepng_state_copy(LodePNGState* dest, const LodePNGState* source)
{
  lodepng_state_cleanup(dest);
  *dest = *source;
  lodepng_color_mode_init(&dest->info_raw);
  lodepng_info_init(&dest->info_png);
  dest->error = lodepng_color_mode_copy(&dest->info_raw, &source->info_raw); if(dest->error) return;
  dest->error = lodepng_info_copy(&dest->info_png, &source->info_png); if(dest->error) return;
}